

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferMemoryAliasing.cpp
# Opt level: O2

UVec3 __thiscall
vkt::sparse::anon_unknown_0::computeWorkGroupSize(anon_unknown_0 *this,deUint32 numInvocations)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  deUint32 numInvocationsLeft;
  uint uVar4;
  uint uVar5;
  UVec3 UVar6;
  
  uVar4 = 0x80;
  if (numInvocations < 0x80) {
    uVar4 = numInvocations;
  }
  uVar2 = (numInvocations / uVar4 + 1) - (uint)(numInvocations % uVar4 == 0);
  uVar5 = (uint)(byte)(0x80 / (byte)uVar4);
  if (uVar2 < uVar5) {
    uVar5 = uVar2;
  }
  uVar3 = (uVar2 / uVar5 + 1) - (uint)(uVar2 % uVar5 == 0);
  uVar2 = uVar5 * uVar4 & 0xffff;
  uVar1 = 0x80 / uVar2;
  if (uVar1 <= uVar3) {
    uVar3 = uVar1;
  }
  uVar1 = 0x40;
  if (uVar3 < 0x40) {
    uVar1 = uVar3;
  }
  *(uint *)this = uVar4;
  *(uint *)(this + 4) = uVar5;
  *(uint *)(this + 8) = uVar1;
  UVar6.m_data[2] = 0x80 % uVar2;
  UVar6.m_data._0_8_ = this;
  return (UVec3)UVar6.m_data;
}

Assistant:

tcu::UVec3 computeWorkGroupSize (const deUint32 numInvocations)
{
	const deUint32		maxComputeWorkGroupInvocations	= 128u;
	const tcu::UVec3	maxComputeWorkGroupSize			= tcu::UVec3(128u, 128u, 64u);
	deUint32			numInvocationsLeft				= numInvocations;

	const deUint32 xWorkGroupSize = std::min(std::min(numInvocationsLeft, maxComputeWorkGroupSize.x()), maxComputeWorkGroupInvocations);
	numInvocationsLeft = numInvocationsLeft / xWorkGroupSize + ((numInvocationsLeft % xWorkGroupSize) ? 1u : 0u);

	const deUint32 yWorkGroupSize = std::min(std::min(numInvocationsLeft, maxComputeWorkGroupSize.y()), maxComputeWorkGroupInvocations / xWorkGroupSize);
	numInvocationsLeft = numInvocationsLeft / yWorkGroupSize + ((numInvocationsLeft % yWorkGroupSize) ? 1u : 0u);

	const deUint32 zWorkGroupSize = std::min(std::min(numInvocationsLeft, maxComputeWorkGroupSize.z()), maxComputeWorkGroupInvocations / (xWorkGroupSize*yWorkGroupSize));
	numInvocationsLeft = numInvocationsLeft / zWorkGroupSize + ((numInvocationsLeft % zWorkGroupSize) ? 1u : 0u);

	return tcu::UVec3(xWorkGroupSize, yWorkGroupSize, zWorkGroupSize);
}